

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

uint __thiscall IR::Instr::GetAsmJsArgOutSize(Instr *this)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  StackSym *pSVar5;
  Instr *pIVar6;
  undefined4 *puVar7;
  IntConstOpnd *pIVar8;
  
  OVar1 = this->m_opcode;
  if ((OVar1 == StartCall) || (OVar1 == LoweredStartCall)) {
    pIVar8 = Opnd::AsIntConstOpnd(this->m_src2);
    uVar4 = IntConstOpnd::AsUint32(pIVar8);
    return uVar4;
  }
  if (OVar1 == InlineeEnd) {
    OVar1 = InlineeEnd;
    while ((OVar1 != StartCall && (OVar1 != LoweredStartCall))) {
      pSVar5 = Opnd::GetStackSym(this->m_src2);
      this = (pSVar5->field_5).m_instrDef;
      pIVar6 = this;
      if ((pSVar5->field_0x18 & 1) == 0) {
        pIVar6 = (Instr *)0x0;
      }
      OVar1 = pIVar6->m_opcode;
    }
    pIVar8 = Opnd::AsIntConstOpnd(this->m_src2);
    uVar4 = IntConstOpnd::AsUint32(pIVar8);
    uVar4 = UInt32Math::Add(uVar4,0x18);
    return uVar4;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar7 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                     ,0xe56,"((0))","UNREACHED");
  if (bVar3) {
    *puVar7 = 0;
    return 0;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

uint Instr::GetAsmJsArgOutSize()
{
    switch (m_opcode)
    {
    case Js::OpCode::StartCall:
    case Js::OpCode::LoweredStartCall:
        return GetSrc2()->AsIntConstOpnd()->AsUint32();

    case Js::OpCode::InlineeEnd:
    {
        // StartCall instr has the size, so walk back to it
        IR::Instr *argInstr = this;
        while(argInstr->m_opcode != Js::OpCode::StartCall && argInstr->m_opcode != Js::OpCode::LoweredStartCall)
        {
            argInstr = argInstr->GetSrc2()->GetStackSym()->GetInstrDef();
        }
        // add StartCall arg size with inlinee meta args for full size
        uint size = UInt32Math::Add(argInstr->GetSrc2()->AsIntConstOpnd()->AsUint32(), Js::Constants::InlineeMetaArgCount * MachPtr);
        return size;
    }
    default:
        Assert(UNREACHED);
        return 0;
    }
    }